

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simplex.cc
# Opt level: O2

void __thiscall fizplex::Simplex::solve(Simplex *this)

{
  double dVar1;
  Candidate candidate_00;
  Candidate candidate_01;
  Candidate candidate_02;
  RatioTestResult rt_00;
  RatioTestResult rt_01;
  Result RVar2;
  double *pdVar3;
  int round;
  IterationDecision iteration_decision;
  Candidate candidate;
  RatioTestResult rt;
  Base base;
  
  set_initial_x(this);
  round = 0;
  do {
    if (round == 5000) {
      return;
    }
    Base::Base(&base,this->lp,&this->basic_indices);
    set_basic_solution(this,&base);
    if (this->phase == One) {
      set_phase_one_objective(this);
    }
    dVar1 = DVector::operator*(&this->c,&this->x);
    this->z = dVar1;
    run_price(&candidate,this,&base);
    iteration_decision = Unfinished;
    if (candidate.is_optimal == true) {
      iteration_decision = decision_for_optimality(this);
    }
    candidate_00._1_7_ = candidate._1_7_;
    candidate_00.is_optimal = candidate.is_optimal;
    candidate_00.index = candidate.index;
    candidate_00.cost = candidate.cost;
    run_ratio_test(&rt,this,candidate_00,&base);
    if (iteration_decision == Unfinished) {
      iteration_decision = rt.result;
    }
    if (0 < this->print_level) {
      print_iteration_results(this,&iteration_decision,round);
    }
    dVar1 = rt.step_length;
    switch(iteration_decision) {
    case Unbounded:
      rt_01._4_4_ = rt._4_4_;
      rt_01.result = rt.result;
      candidate_02._1_7_ = candidate._1_7_;
      candidate_02.is_optimal = candidate.is_optimal;
      candidate_02.index = candidate.index;
      candidate_02.cost = candidate.cost;
      rt_01.leaving_index = rt.leaving_index;
      rt_01.step_length = rt.step_length;
      rt_01.leaving_bound = rt.leaving_bound;
      set_result_for_unbounded(this,candidate_02,rt_01);
      goto LAB_00111289;
    case BoundFlip:
      pdVar3 = DVector::operator[](&this->x,candidate.index);
      *pdVar3 = dVar1 + *pdVar3;
      break;
    case BaseChange:
      rt_00._4_4_ = rt._4_4_;
      rt_00.result = rt.result;
      candidate_01._1_7_ = candidate._1_7_;
      candidate_01.is_optimal = candidate.is_optimal;
      candidate_01.index = candidate.index;
      candidate_01.cost = candidate.cost;
      rt_00.leaving_index = rt.leaving_index;
      rt_00.step_length = rt.step_length;
      rt_00.leaving_bound = rt.leaving_bound;
      exchange_base_column(this,candidate_01,rt_00);
      break;
    case OptimalSolution:
      RVar2 = OptimalSolution;
      goto LAB_00111286;
    case SwitchToPhaseTwo:
      this->phase = Two;
      DVector::operator=(&this->c,&this->lp->c);
      break;
    case Infeasible:
      RVar2 = Infeasible;
LAB_00111286:
      this->result = RVar2;
LAB_00111289:
      Base::~Base(&base);
      return;
    default:
      __assert_fail("false",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/LeFiz[P]Fizplex/src/simplex.cc"
                    ,0x59,"void fizplex::Simplex::solve()");
    }
    Base::~Base(&base);
    round = round + 1;
  } while( true );
}

Assistant:

void Simplex::solve() {
  set_initial_x();

  for (int round = 0; round < max_rounds; round++) {
    Base base(lp, basic_indices);
    set_basic_solution(base);

    if (phase == Simplex::Phase::One)
      set_phase_one_objective();
    z = c * x;

    const auto candidate = run_price(base);

    IterationDecision iteration_decision = IterationDecision::Unfinished;
    if (candidate.is_optimal)
      iteration_decision = decision_for_optimality();

    const auto rt = run_ratio_test(candidate, base);
    if (iteration_decision == IterationDecision::Unfinished)
      iteration_decision = rt.result;

    if (print_level > 0)
      print_iteration_results(iteration_decision, round);

    switch (iteration_decision) {
    case IterationDecision::BaseChange: {
      exchange_base_column(candidate, rt);
      break;
    }
    case IterationDecision::Unbounded:
      set_result_for_unbounded(candidate, rt);
      return;
    case IterationDecision::BoundFlip:
      x[candidate.index] += rt.step_length;
      break;
    case IterationDecision::OptimalSolution:
      result = Result::OptimalSolution;
      return;
    case IterationDecision::SwitchToPhaseTwo:
      phase = Simplex::Phase::Two;
      c = lp.c;
      break;
    case IterationDecision::Infeasible:
      result = Result::Infeasible;
      return;
    default:
      assert(false);
    }
  }
}